

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O0

void __thiscall
kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::destroy
          (OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *this)

{
  bool t;
  bool t_1;
  OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *this_local;
  
  t = destroyVariant<kj::HttpInputStream::Request>(this);
  t_1 = destroyVariant<kj::HttpInputStream::Connect>(this);
  OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>::doAll<bool,bool>
            ((OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect> *)this,t,t_1);
  return;
}

Assistant:

void destroy() {
    doAll(destroyVariant<Variants>()...);
  }